

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::StringMaker<sisl::cartesian_cubic<float>*>::convert<sisl::cartesian_cubic<float>>
          (string *__return_storage_ptr__,StringMaker<sisl::cartesian_cubic<float>*> *this,
          cartesian_cubic<float> *p)

{
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  if (this == (StringMaker<sisl::cartesian_cubic<float>*> *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"__null","");
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::_M_insert<void_const*>(local_190);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( U* p ) {
        if( !p )
            return INTERNAL_CATCH_STRINGIFY( NULL );
        std::ostringstream oss;
        oss << p;
        return oss.str();
    }